

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

void av1_calculate_ref_frame_side(AV1_COMMON *cm)

{
  uint b;
  SequenceHeader *pSVar1;
  int iVar2;
  RefCntBuffer *pRVar3;
  undefined1 uVar4;
  long lVar5;
  uint a;
  
  pSVar1 = cm->seq_params;
  cm->ref_frame_side[0] = '\0';
  cm->ref_frame_side[1] = '\0';
  cm->ref_frame_side[2] = '\0';
  cm->ref_frame_side[3] = '\0';
  cm->ref_frame_side[4] = '\0';
  cm->ref_frame_side[5] = '\0';
  cm->ref_frame_side[6] = '\0';
  cm->ref_frame_side[7] = '\0';
  if ((pSVar1->order_hint_info).enable_order_hint != 0) {
    b = cm->cur_frame->order_hint;
    for (lVar5 = 0x6385; lVar5 != 0x638c; lVar5 = lVar5 + 1) {
      pRVar3 = get_ref_frame_buf(cm,(char)lVar5 + '|');
      if (pRVar3 == (RefCntBuffer *)0x0) {
        a = 0;
      }
      else {
        a = pRVar3->order_hint;
      }
      iVar2 = get_relative_dist(&pSVar1->order_hint_info,a,b);
      uVar4 = 1;
      if ((0 < iVar2) || (uVar4 = 0xff, a == b)) {
        *(undefined1 *)((long)cm->buffer_removal_times + lVar5 + -0x54) = uVar4;
      }
    }
  }
  return;
}

Assistant:

void av1_calculate_ref_frame_side(AV1_COMMON *cm) {
  const OrderHintInfo *const order_hint_info = &cm->seq_params->order_hint_info;

  memset(cm->ref_frame_side, 0, sizeof(cm->ref_frame_side));
  if (!order_hint_info->enable_order_hint) return;

  const int cur_order_hint = cm->cur_frame->order_hint;

  for (int ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ref_frame++) {
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
    int order_hint = 0;

    if (buf != NULL) order_hint = buf->order_hint;

    if (get_relative_dist(order_hint_info, order_hint, cur_order_hint) > 0)
      cm->ref_frame_side[ref_frame] = 1;
    else if (order_hint == cur_order_hint)
      cm->ref_frame_side[ref_frame] = -1;
  }
}